

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void el::LevelHelper::forEachLevel(EnumType *startIndex,function<bool_()> *fn)

{
  EnumType EVar1;
  bool bVar2;
  int iVar3;
  function<bool_()> *pfVar4;
  
  pfVar4 = (function<bool_()> *)startIndex;
  while (iVar3 = (int)pfVar4, (fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    pfVar4 = fn;
    bVar2 = (*fn->_M_invoker)((_Any_data *)fn);
    if ((bVar2) || (EVar1 = *startIndex, *startIndex = EVar1 * 2, 0x80 < EVar1 * 2)) {
      return;
    }
  }
  std::__throw_bad_function_call();
  if (iVar3 < 0x20) {
    switch(iVar3) {
    case 1:
      return;
    case 2:
      return;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      return;
    case 8:
      return;
    default:
      if (iVar3 == 0x10) {
        return;
      }
    }
  }
  else if (iVar3 < 0x80) {
    if (iVar3 == 0x20) {
      return;
    }
    if (iVar3 == 0x40) {
      return;
    }
  }
  else {
    if (iVar3 == 0x80) {
      return;
    }
    if (iVar3 == 0x100) {
      return;
    }
  }
  return;
}

Assistant:

void LevelHelper::forEachLevel(base::type::EnumType* startIndex, const std::function<bool(void)>& fn) {
  base::type::EnumType lIndexMax = LevelHelper::kMaxValid;
  do {
    if (fn()) {
      break;
    }
    *startIndex = static_cast<base::type::EnumType>(*startIndex << 1);
  } while (*startIndex <= lIndexMax);
}